

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS
ref_geom_add_between
          (REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_DBL node1_weight,REF_INT new_node)

{
  REF_INT RVar1;
  int iVar2;
  REF_GEOM ref_geom;
  REF_CELL ref_cell;
  REF_INT *pRVar3;
  REF_DBL *pRVar4;
  uint uVar5;
  uint uVar6;
  REF_NODE pRVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  undefined8 extraout_XMM0_Qb;
  double dVar14;
  double dVar15;
  REF_INT sense;
  REF_DBL param [2];
  REF_INT ncell;
  REF_INT face_geom;
  REF_INT cell;
  REF_INT geom1;
  REF_INT geom0;
  REF_INT edge_geom;
  REF_BOOL supported;
  REF_INT cells [2];
  REF_DBL param1 [2];
  REF_DBL param0 [2];
  REF_INT nodes [27];
  uint local_1c4;
  REF_CELL local_1c0;
  REF_NODE local_1b8;
  double local_1b0;
  double local_1a8;
  uint local_19c;
  REF_DBL local_198;
  REF_DBL local_190;
  ulong local_180;
  REF_DBL local_178;
  REF_DBL local_170;
  int local_168;
  REF_INT local_164;
  double local_160;
  REF_DBL local_158;
  int local_150;
  int local_14c;
  undefined8 local_148;
  double local_140;
  double local_138;
  undefined8 local_128;
  double local_120;
  double local_118;
  double local_110;
  REF_DBL local_108 [4];
  double local_e8;
  double local_d8;
  undefined8 uStack_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  REF_INT local_a8 [30];
  
  uVar9 = (ulong)(uint)new_node;
  ref_geom = ref_grid->geom;
  if ((node0 < 0) || (ref_geom->ref_adj->nnode <= node0)) {
    bVar10 = false;
  }
  else {
    bVar10 = ref_geom->ref_adj->first[(uint)node0] != -1;
  }
  bVar11 = false;
  if (-1 < node1) {
    if (node1 < ref_geom->ref_adj->nnode) {
      bVar11 = ref_geom->ref_adj->first[(uint)node1] != -1;
    }
    else {
      bVar11 = false;
    }
  }
  if (!(bool)(bVar10 & bVar11)) {
    return 0;
  }
  local_1b8 = ref_grid->node;
  local_110 = 1.0 - node1_weight;
  ref_cell = ref_grid->cell[0];
  local_158 = node1_weight;
  local_a8[0] = node0;
  local_a8[1] = node1;
  local_19c = ref_cell_with(ref_cell,local_a8,&local_164);
  if (local_19c == 5) {
    local_148._0_4_ = -1;
    goto LAB_0017b8fc;
  }
  if (local_19c != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x4b9,
           "ref_geom_add_between",(ulong)local_19c,"search for edg");
    return local_19c;
  }
  uVar6 = 0;
  local_180 = uVar9;
  uVar5 = ref_cell_nodes(ref_cell,local_164,local_a8);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x4ba,
           "ref_geom_add_between",(ulong)uVar5,"get id");
    return uVar5;
  }
  local_1c0 = (REF_CELL)CONCAT44(local_1c0._4_4_,local_a8[ref_cell->node_per]);
  uVar5 = ref_geom_cell_tuv(ref_geom,node0,local_a8,1,&local_b8,(REF_INT *)&local_1c4);
  uVar9 = local_180;
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x4be,
           "ref_geom_add_between",(ulong)uVar5,"cell uv");
    return uVar5;
  }
  uVar5 = ref_geom_cell_tuv(ref_geom,node1,local_a8,1,&local_c8,(REF_INT *)&local_1c4);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x4c0,
           "ref_geom_add_between",(ulong)uVar5);
    return uVar5;
  }
  local_198 = local_110 * local_b8 + local_c8 * local_158;
  local_1a8 = local_b8;
  local_1b0 = local_c8;
  RVar1 = (REF_INT)uVar9;
  local_178 = local_198;
  if (ref_geom->model != (void *)0x0) {
    uVar5 = ref_egads_inverse_eval
                      (ref_geom,1,(REF_INT)local_1c0,local_1b8->real + RVar1 * 0xf,&local_198);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x4c5,
             "ref_geom_add_between",(ulong)uVar5);
      ref_geom_tec(ref_grid,"ref_geom_split_edge.tec");
      return uVar5;
    }
  }
  dVar12 = local_1a8;
  if (local_1b0 <= local_1a8) {
    dVar12 = local_1b0;
  }
  if (local_198 < dVar12) {
LAB_0017c164:
    local_198 = local_178;
  }
  else {
    dVar13 = local_1a8;
    if (local_1a8 <= local_1b0) {
      dVar13 = local_1b0;
    }
    if (dVar13 < local_198) goto LAB_0017c164;
  }
  if (ref_geom->model != (void *)0x0) {
    local_160 = dVar12;
    uVar5 = ref_egads_eval_at(ref_geom,1,(REF_INT)local_1c0,&local_198,local_108,(REF_DBL *)0x0);
    if (uVar5 == 0) {
      pRVar4 = local_1b8->real;
      lVar8 = 0;
      do {
        (&local_128)[lVar8] = pRVar4[node0 * 0xf + lVar8] - local_108[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      pRVar4 = local_1b8->real;
      lVar8 = 0;
      do {
        (&local_148)[lVar8] = pRVar4[node1 * 0xf + lVar8] - local_108[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      uStack_d0 = 0;
      local_d8 = local_118 * local_118 +
                 (double)CONCAT44(local_128._4_4_,(int)local_128) *
                 (double)CONCAT44(local_128._4_4_,(int)local_128) + local_120 * local_120;
      if (local_d8 < 0.0) {
        local_d8 = sqrt(local_d8);
        uStack_d0 = extraout_XMM0_Qb;
      }
      else {
        local_d8 = SQRT(local_d8);
      }
      local_e8 = local_138 * local_138 +
                 (double)CONCAT44(local_148._4_4_,(int)local_148) *
                 (double)CONCAT44(local_148._4_4_,(int)local_148) + local_140 * local_140;
      if (local_e8 < 0.0) {
        local_e8 = sqrt(local_e8);
      }
      else {
        local_e8 = SQRT(local_e8);
      }
      local_170 = local_178;
      uVar5 = ref_egads_eval_at(ref_geom,1,(REF_INT)local_1c0,&local_170,local_108,(REF_DBL *)0x0);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x4dd,"ref_geom_add_between",(ulong)uVar5,"eval");
        goto LAB_0017c356;
      }
      dVar12 = (local_e8 + local_d8) * 1e+20;
      if (dVar12 <= -dVar12) {
        dVar12 = -dVar12;
      }
      dVar13 = local_d8;
      if (local_d8 <= -local_d8) {
        dVar13 = -local_d8;
      }
      local_d8 = (double)(~-(ulong)(dVar13 < dVar12) & 0xbff0000000000000 |
                         (ulong)(local_d8 / (local_e8 + local_d8)) & -(ulong)(dVar13 < dVar12));
      pRVar4 = local_1b8->real;
      lVar8 = 0;
      do {
        (&local_128)[lVar8] = pRVar4[node0 * 0xf + lVar8] - local_108[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      pRVar4 = local_1b8->real;
      lVar8 = 0;
      do {
        (&local_148)[lVar8] = pRVar4[node1 * 0xf + lVar8] - local_108[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      dVar12 = local_118 * local_118 +
               (double)CONCAT44(local_128._4_4_,(int)local_128) *
               (double)CONCAT44(local_128._4_4_,(int)local_128) + local_120 * local_120;
      if (dVar12 < 0.0) {
        dVar12 = sqrt(dVar12);
      }
      else {
        dVar12 = SQRT(dVar12);
      }
      dVar13 = local_138 * local_138 +
               (double)CONCAT44(local_148._4_4_,(int)local_148) *
               (double)CONCAT44(local_148._4_4_,(int)local_148) + local_140 * local_140;
      if (dVar13 < 0.0) {
        local_e8 = dVar12;
        dVar13 = sqrt(dVar13);
        dVar12 = local_e8;
      }
      else {
        dVar13 = SQRT(dVar13);
      }
      dVar14 = (dVar13 + dVar12) * 1e+20;
      if (dVar14 <= -dVar14) {
        dVar14 = -dVar14;
      }
      dVar15 = dVar12;
      if (dVar12 <= -dVar12) {
        dVar15 = -dVar12;
      }
      dVar12 = (double)(~-(ulong)(dVar15 < dVar14) & 0xbff0000000000000 |
                       (ulong)(dVar12 / (dVar13 + dVar12)) & -(ulong)(dVar15 < dVar14)) - local_158;
      if (dVar12 <= -dVar12) {
        dVar12 = -dVar12;
      }
      dVar13 = local_d8 - local_158;
      if (dVar13 <= -dVar13) {
        dVar13 = -dVar13;
      }
      bVar10 = true;
      if (dVar12 < dVar13) {
        local_198 = local_170;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x4cf,
             "ref_geom_add_between",(ulong)uVar5);
LAB_0017c356:
      bVar10 = false;
      uVar6 = uVar5;
    }
    dVar12 = local_160;
    if (!bVar10) {
      return uVar6;
    }
  }
  if (local_198 < dVar12) {
LAB_0017c388:
    local_198 = local_178;
  }
  else {
    dVar12 = local_1a8;
    if (local_1a8 <= local_1b0) {
      dVar12 = local_1b0;
    }
    if (dVar12 < local_198) goto LAB_0017c388;
  }
  uVar6 = ref_geom_add(ref_geom,RVar1,1,(REF_INT)local_1c0,&local_198);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x4f2,
           "ref_geom_add_between",(ulong)uVar6,"new geom");
    return uVar6;
  }
  uVar6 = ref_geom_find(ref_geom,RVar1,1,(REF_INT)local_1c0,(REF_INT *)&local_148);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x4f5,
           "ref_geom_add_between",(ulong)uVar6,"find the new edge for later face uv evaluation");
    return uVar6;
  }
LAB_0017b8fc:
  local_1c0 = ref_grid->cell[3];
  uVar6 = ref_cell_list_with2(local_1c0,node0,node1,2,(REF_INT *)&local_170,(REF_INT *)local_108);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x4fa,
           "ref_geom_add_between",(ulong)uVar6,"list");
    return uVar6;
  }
  if ((long)local_170._0_4_ != 0) {
    if ((ref_geom->manifold != 0) && (local_170._0_4_ != 2)) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x504,
             "ref_geom_add_between","expected two tri for between",2,(long)local_170._0_4_);
      ref_geom_tattle(ref_geom,node0);
      ref_geom_tattle(ref_geom,node1);
      pRVar7 = local_1b8;
      ref_node_location(local_1b8,node0);
      ref_node_location(pRVar7,node1);
      return 1;
    }
    if (0 < local_170._0_4_) {
      local_1b0 = (double)((long)(int)local_148 * 2);
      local_178 = (REF_DBL)((long)(int)local_148 * 6 + 1);
      pRVar7 = (REF_NODE)0x0;
      local_180 = uVar9;
      do {
        local_164 = *(REF_INT *)((long)local_108 + (long)pRVar7 * 4);
        local_1b8 = pRVar7;
        uVar6 = ref_cell_nodes(local_1c0,local_164,local_a8);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x508,"ref_geom_add_between",(ulong)uVar6,"get id");
          return uVar6;
        }
        uVar6 = ref_geom_tri_supported(ref_geom,local_a8,(REF_BOOL *)&local_128);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x50a,"ref_geom_add_between",(ulong)uVar6,"tri support");
          return uVar6;
        }
        if ((int)local_128 != 0) {
          RVar1 = local_a8[local_1c0->node_per];
          uVar6 = ref_geom_cell_tuv(ref_geom,node0,local_a8,2,&local_b8,(REF_INT *)&local_1c4);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x510,"ref_geom_add_between",(ulong)uVar6,"cell uv");
            return uVar6;
          }
          uVar6 = ref_geom_cell_tuv(ref_geom,node1,local_a8,2,&local_c8,(REF_INT *)&local_1c4);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x512,"ref_geom_add_between",(ulong)uVar6,"cell uv");
            return uVar6;
          }
          local_198 = local_b8 * local_110 + local_c8 * local_158;
          local_190 = local_b0 * local_110 + local_c0 * local_158;
          uVar6 = ref_geom_add(ref_geom,(REF_INT)local_180,2,RVar1,&local_198);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x516,"ref_geom_add_between",(ulong)uVar6,"new geom");
            return uVar6;
          }
          uVar6 = ref_geom_find(ref_geom,(REF_INT)local_180,2,RVar1,&local_168);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x518,"ref_geom_add_between",(ulong)uVar6,"new face geom");
            return uVar6;
          }
          uVar6 = ref_geom_find(ref_geom,node0,2,RVar1,&local_14c);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x51a,"ref_geom_add_between",(ulong)uVar6,"face geom");
            return uVar6;
          }
          uVar6 = ref_geom_find(ref_geom,node1,2,RVar1,&local_150);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x51b,"ref_geom_add_between",(ulong)uVar6,"face geom");
            return uVar6;
          }
          pRVar3 = ref_geom->descr;
          iVar2 = pRVar3[(long)local_14c * 6 + 3];
          if ((iVar2 != 0) && (iVar2 == pRVar3[(long)local_150 * 6 + 3])) {
            pRVar3[(long)local_168 * 6 + 3] = iVar2;
          }
          uVar9 = local_180;
          if ((local_19c != 5) && (ref_geom->model != (void *)0x0)) {
            lVar8 = (long)local_168;
            local_1a8 = (double)(lVar8 * 2);
            local_1c4 = (uint)(pRVar3[(long)(local_168 * 6) + 3] != 0);
            uVar6 = ref_egads_edge_face_uv
                              (ref_geom,pRVar3[(long)local_178],pRVar3[lVar8 * 6 + 1],local_1c4,
                               ref_geom->param[(long)local_1b0],&local_198);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x52c,"ref_geom_add_between",(ulong)uVar6,"edge t param");
              return uVar6;
            }
            pRVar4 = ref_geom->param;
            pRVar4[lVar8 * 2] = local_198;
            pRVar4[SUB84(local_1a8,0) + 1] = local_190;
            uVar9 = local_180;
          }
        }
        pRVar7 = (REF_NODE)((long)&local_1b8->n + 1);
      } while ((long)pRVar7 < (long)local_170._0_4_);
    }
    if (((local_19c == 5) && (ref_geom->model != (void *)0x0)) &&
       (uVar6 = ref_geom_add_between_face_interior(ref_grid,node0,node1,local_158,(REF_INT)uVar9),
       uVar6 != 0)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x535,
             "ref_geom_add_between",(ulong)uVar6,"position new node in uv");
      return uVar6;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_add_between(REF_GRID ref_grid, REF_INT node0,
                                        REF_INT node1, REF_DBL node1_weight,
                                        REF_INT new_node) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT type, id;
  REF_DBL param[2], param0[2], param1[2];
  REF_BOOL has_edge_support, supported;
  REF_INT edge_geom;
  REF_INT sense, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_STATUS status;
  REF_INT i, ncell, cells[2];
  REF_INT face_geom, geom0, geom1;
  REF_BOOL support0, support1;
  REF_DBL node0_weight = 1.0 - node1_weight;

  RSS(ref_geom_supported(ref_geom, node0, &support0), "node0 supported");
  RSS(ref_geom_supported(ref_geom, node1, &support1), "node1 supported");
  if (!support0 || !support1) {
    return REF_SUCCESS;
  }

  /* insert edge geom on edge cell if present */
  nodes[0] = node0;
  nodes[1] = node1;
  ref_cell = ref_grid_edg(ref_grid);
  status = ref_cell_with(ref_cell, nodes, &cell);
  if (REF_NOT_FOUND == status) {
    has_edge_support = REF_FALSE;
    edge_geom = REF_EMPTY;
  } else {
    RSS(status, "search for edg");
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "get id");
    id = nodes[ref_cell_node_per(ref_cell)];
    type = REF_GEOM_EDGE;
    RSS(ref_geom_cell_tuv(ref_geom, node0, nodes, type, param0, &sense),
        "cell uv");
    RSS(ref_geom_cell_tuv(ref_geom, node1, nodes, type, param1, &sense),
        "cell uv");
    param[0] = node0_weight * param0[0] + node1_weight * param1[0];
    if (ref_geom_model_loaded(ref_geom))
      RSB(ref_egads_inverse_eval(ref_geom, type, id,
                                 ref_node_xyz_ptr(ref_node, new_node), param),
          "inv eval edge", ref_geom_tec(ref_grid, "ref_geom_split_edge.tec"));
    /* enforce bounding box and use midpoint as full-back */
    if (param[0] < MIN(param0[0], param1[0]) ||
        MAX(param0[0], param1[0]) < param[0])
      param[0] = node0_weight * param0[0] + node1_weight * param1[0];
    if (ref_geom_model_loaded(ref_geom)) { /* check weight and distance ratio */
      REF_DBL xyz[3], dx0[3], dx1[3], d0, d1, total, actual_weight;
      REF_DBL mid_t, mid_weight;
      REF_INT ii;
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_EDGE, id, param, xyz, NULL),
          "eval");
      for (ii = 0; ii < 3; ii++)
        dx0[ii] = ref_node_xyz(ref_node, ii, node0) - xyz[ii];
      for (ii = 0; ii < 3; ii++)
        dx1[ii] = ref_node_xyz(ref_node, ii, node1) - xyz[ii];
      d0 = sqrt(ref_math_dot(dx0, dx0));
      d1 = sqrt(ref_math_dot(dx1, dx1));
      total = d0 + d1;
      actual_weight = -1.0;
      if (ref_math_divisible(d0, total)) {
        actual_weight = d0 / total;
      }
      mid_t = node0_weight * param0[0] + node1_weight * param1[0];
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_EDGE, id, &mid_t, xyz, NULL),
          "eval");
      for (ii = 0; ii < 3; ii++)
        dx0[ii] = ref_node_xyz(ref_node, ii, node0) - xyz[ii];
      for (ii = 0; ii < 3; ii++)
        dx1[ii] = ref_node_xyz(ref_node, ii, node1) - xyz[ii];
      d0 = sqrt(ref_math_dot(dx0, dx0));
      d1 = sqrt(ref_math_dot(dx1, dx1));
      total = d0 + d1;
      mid_weight = -1.0;
      if (ref_math_divisible(d0, total)) {
        mid_weight = d0 / total;
      }
      if (ABS(mid_weight - node1_weight) < ABS(actual_weight - node1_weight)) {
        /* printf("request %f actual %f mid %f\n",
                  node1_weight,actual_weight,mid_weight); */
        param[0] = mid_t;
      }
    }
    if (param[0] < MIN(param0[0], param1[0]) ||
        MAX(param0[0], param1[0]) < param[0])
      param[0] = node0_weight * param0[0] + node1_weight * param1[0];
    RSS(ref_geom_add(ref_geom, new_node, type, id, param), "new geom");
    has_edge_support = REF_TRUE;
    RSS(ref_geom_find(ref_geom, new_node, type, id, &edge_geom),
        "find the new edge for later face uv evaluation");
  }

  /* insert face between */
  ref_cell = ref_grid_tri(ref_grid);
  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cells), "list");
  if (0 == ncell) { /* volume edge */
    return REF_SUCCESS;
  }
  if (ref_geom_manifold(ref_geom)) {
    REIB(2, ncell, "expected two tri for between", {
      ref_geom_tattle(ref_geom, node0);
      ref_geom_tattle(ref_geom, node1);
      ref_node_location(ref_node, node0);
      ref_node_location(ref_node, node1);
    });
  }
  for (i = 0; i < ncell; i++) {
    cell = cells[i];
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "get id");

    RSS(ref_geom_tri_supported(ref_geom, nodes, &supported), "tri support");
    if (!supported) continue; /* no geom support, skip */

    id = nodes[ref_cell_node_per(ref_cell)];
    type = REF_GEOM_FACE;
    RSS(ref_geom_cell_tuv(ref_geom, node0, nodes, type, param0, &sense),
        "cell uv");
    RSS(ref_geom_cell_tuv(ref_geom, node1, nodes, type, param1, &sense),
        "cell uv");
    param[0] = node0_weight * param0[0] + node1_weight * param1[0];
    param[1] = node0_weight * param0[1] + node1_weight * param1[1];

    RSS(ref_geom_add(ref_geom, new_node, type, id, param), "new geom");
    RSS(ref_geom_find(ref_geom, new_node, type, id, &face_geom),
        "new face geom");

    RSS(ref_geom_find(ref_geom, node0, type, id, &geom0), "face geom");
    RSS(ref_geom_find(ref_geom, node1, type, id, &geom1), "face geom");
    if (0 != ref_geom_jump(ref_geom, geom0) &&
        0 != ref_geom_jump(ref_geom, geom1) &&
        ref_geom_jump(ref_geom, geom0) == ref_geom_jump(ref_geom, geom1)) {
      ref_geom_jump(ref_geom, face_geom) = ref_geom_jump(ref_geom, geom0);
    }

    /* if there is an edge between, set the face uv based on edge t */
    if (ref_geom_model_loaded(ref_geom) && has_edge_support) {
      REF_INT faceid, edgeid;
      REF_DBL t;
      edgeid = ref_geom_id(ref_geom, edge_geom);
      faceid = ref_geom_id(ref_geom, face_geom);
      t = ref_geom_param(ref_geom, 0, edge_geom);
      sense = 0;
      if (0 != ref_geom_jump(ref_geom, face_geom)) sense = 1;
      RSS(ref_egads_edge_face_uv(ref_geom, edgeid, faceid, sense, t, param),
          "edge t param");
      ref_geom_param(ref_geom, 0, face_geom) = param[0];
      ref_geom_param(ref_geom, 1, face_geom) = param[1];
    }
  }

  if (ref_geom_model_loaded(ref_geom) && !has_edge_support) {
    RSS(ref_geom_add_between_face_interior(ref_grid, node0, node1, node1_weight,
                                           new_node),
        "position new node in uv");
  }

  return REF_SUCCESS;
}